

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int findLocation(string *str,int begin,int end,char op)

{
  char cVar1;
  char *pcVar2;
  runtime_error *prVar3;
  int local_2c;
  int iStack_28;
  char c;
  int i;
  int level;
  char op_local;
  int end_local;
  int begin_local;
  string *str_local;
  
  iStack_28 = 0;
  local_2c = end + -1;
  do {
    if (local_2c < begin) {
      if (iStack_28 < 1) {
        return end;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"parentheses mismatch");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    cVar1 = *pcVar2;
    if (cVar1 == ')') {
      iStack_28 = iStack_28 + 1;
    }
    else if (cVar1 == '(') {
      iStack_28 = iStack_28 + -1;
      if (iStack_28 < 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"parentheses mismatch");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((iStack_28 < 1) && (cVar1 == op)) {
      return local_2c;
    }
    local_2c = local_2c + -1;
  } while( true );
}

Assistant:

int findLocation(const std::string& str, int begin, int end, char op)
{
  int level = 0;
  for (int i=end-1; i>=begin; --i) {
    char c = str[i];
    if (c == ')') {
      ++level;
      continue;
    }
    if (c == '(') {
      --level;
      if (level < 0)
        throw std::runtime_error("parentheses mismatch");
      continue;
    }
    if (level > 0) continue;
    if (c == op)
      return i;
  }
  if (level > 0) throw std::runtime_error("parentheses mismatch");
  return end;
}